

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmVariableWatch.cxx
# Opt level: O0

bool __thiscall
cmVariableWatch::VariableAccessed
          (cmVariableWatch *this,string *variable,int access_type,char *newValue,cmMakefile *mf)

{
  WatchMethod p_Var1;
  bool bVar2;
  pointer ppVar3;
  reference ppPVar4;
  __normal_iterator<cmVariableWatch::Pair_*const_*,_std::vector<cmVariableWatch::Pair_*,_std::allocator<cmVariableWatch::Pair_*>_>_>
  local_68;
  Pair **local_60;
  __normal_iterator<cmVariableWatch::Pair_*const_*,_std::vector<cmVariableWatch::Pair_*,_std::allocator<cmVariableWatch::Pair_*>_>_>
  local_58;
  const_iterator it;
  VectorOfPairs *vp;
  _Self local_40;
  const_iterator mit;
  cmMakefile *mf_local;
  char *newValue_local;
  int access_type_local;
  string *variable_local;
  cmVariableWatch *this_local;
  
  mit._M_node = (_Base_ptr)mf;
  local_40._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmVariableWatch::Pair_*,_std::allocator<cmVariableWatch::Pair_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmVariableWatch::Pair_*,_std::allocator<cmVariableWatch::Pair_*>_>_>_>_>
       ::find(&this->WatchMap,variable);
  vp = (VectorOfPairs *)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmVariableWatch::Pair_*,_std::allocator<cmVariableWatch::Pair_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmVariableWatch::Pair_*,_std::allocator<cmVariableWatch::Pair_*>_>_>_>_>
       ::end(&this->WatchMap);
  bVar2 = std::operator!=(&local_40,(_Self *)&vp);
  if (bVar2) {
    ppVar3 = std::
             _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmVariableWatch::Pair_*,_std::allocator<cmVariableWatch::Pair_*>_>_>_>
             ::operator->(&local_40);
    it._M_current = (Pair **)&ppVar3->second;
    __gnu_cxx::
    __normal_iterator<cmVariableWatch::Pair_*const_*,_std::vector<cmVariableWatch::Pair_*,_std::allocator<cmVariableWatch::Pair_*>_>_>
    ::__normal_iterator(&local_58);
    local_60 = (Pair **)std::
                        vector<cmVariableWatch::Pair_*,_std::allocator<cmVariableWatch::Pair_*>_>::
                        begin(it._M_current);
    local_58._M_current = local_60;
    while( true ) {
      local_68._M_current =
           (Pair **)std::vector<cmVariableWatch::Pair_*,_std::allocator<cmVariableWatch::Pair_*>_>::
                    end(it._M_current);
      bVar2 = __gnu_cxx::operator!=(&local_58,&local_68);
      if (!bVar2) break;
      ppPVar4 = __gnu_cxx::
                __normal_iterator<cmVariableWatch::Pair_*const_*,_std::vector<cmVariableWatch::Pair_*,_std::allocator<cmVariableWatch::Pair_*>_>_>
                ::operator*(&local_58);
      p_Var1 = (*ppPVar4)->Method;
      ppPVar4 = __gnu_cxx::
                __normal_iterator<cmVariableWatch::Pair_*const_*,_std::vector<cmVariableWatch::Pair_*,_std::allocator<cmVariableWatch::Pair_*>_>_>
                ::operator*(&local_58);
      (*p_Var1)(variable,access_type,(*ppPVar4)->ClientData,newValue,(cmMakefile *)mit._M_node);
      __gnu_cxx::
      __normal_iterator<cmVariableWatch::Pair_*const_*,_std::vector<cmVariableWatch::Pair_*,_std::allocator<cmVariableWatch::Pair_*>_>_>
      ::operator++(&local_58,0);
    }
    this_local._7_1_ = true;
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool  cmVariableWatch::VariableAccessed(const std::string& variable,
                                        int access_type,
                                        const char* newValue,
                                        const cmMakefile* mf) const
{
  cmVariableWatch::StringToVectorOfPairs::const_iterator mit =
    this->WatchMap.find(variable);
  if ( mit  != this->WatchMap.end() )
    {
    const cmVariableWatch::VectorOfPairs* vp = &mit->second;
    cmVariableWatch::VectorOfPairs::const_iterator it;
    for ( it = vp->begin(); it != vp->end(); it ++ )
      {
      (*it)->Method(variable, access_type, (*it)->ClientData,
        newValue, mf);
      }
    return true;
    }
  return false;
}